

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::ParenthesizedPropertyExprSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ParenthesizedPropertyExprSyntax *this,
          size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (ParenthesizedPropertyExprSyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 1;
    break;
  case (ParenthesizedPropertyExprSyntax *)0x1:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[2].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (ParenthesizedPropertyExprSyntax *)0x2:
    return *(PtrTokenOrSyntax **)
            &__return_storage_ptr__[3].
             super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  case (ParenthesizedPropertyExprSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 3;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)
         (__index_type *)
         ((long)&(pPVar1->super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>).
                 super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> + 8);
}

Assistant:

PtrTokenOrSyntax ParenthesizedPropertyExprSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openParen;
        case 1: return expr.get();
        case 2: return matchList;
        case 3: return &closeParen;
        default: return nullptr;
    }
}